

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsprintf.c
# Opt level: O1

int vsprintf_s(char *_Dst,size_t _SizeInBytes,char *_Format,__va_list_tag *_ArgList)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  unsigned_long uVar4;
  size_t sVar5;
  char *pcVar6;
  __va_list_tag *in_R8;
  ulong uVar7;
  
  if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 && _Format == (char *)0x0) {
    (*sMBUSafeCRTAssertFunc)
              ("\"format != NULL\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
               ,0x84);
  }
  if (_Format == (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
      return -1;
    }
    pcVar6 = "\"format != NULL\"";
    uVar4 = 0x84;
  }
  else {
    if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 &&
        (_SizeInBytes == 0 || _Dst == (char *)0x0)) {
      (*sMBUSafeCRTAssertFunc)
                ("\"string != NULL && sizeInBytes > 0\"","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                 ,0x85);
    }
    if (_SizeInBytes != 0 && _Dst != (char *)0x0) {
      iVar1 = _vsnprintf_helper((OUTPUTFN)_Dst,(char *)_SizeInBytes,(size_t)_Format,(char *)_ArgList
                                ,in_R8);
      if (((iVar1 < 0) && (*_Dst = '\0', 2 < _SizeInBytes + 1)) && (_SizeInBytes != 0x7fffffff)) {
        sVar5 = 8;
        if (_SizeInBytes - 1 < 8) {
          sVar5 = _SizeInBytes - 1;
        }
        memset(_Dst + 1,0xfd,sVar5);
      }
      if (iVar1 != -2) {
        if (iVar1 < 0) {
          return iVar1;
        }
        if (_SizeInBytes == 0xffffffffffffffff) {
          return iVar1;
        }
        if (_SizeInBytes == 0x7fffffff) {
          return iVar1;
        }
        uVar3 = (ulong)(iVar1 + 1);
        uVar7 = _SizeInBytes - uVar3;
        if (_SizeInBytes < uVar3 || uVar7 == 0) {
          return iVar1;
        }
        sVar5 = 8;
        if (uVar7 < 8) {
          sVar5 = uVar7;
        }
        memset(_Dst + uVar3,0xfd,sVar5);
        return iVar1;
      }
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
                   ,0x8f);
      }
      piVar2 = __errno_location();
      *piVar2 = 0x22;
      if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      pcVar6 = "\"(\\\"Buffer too small\\\" && 0)\"";
      uVar4 = 0x8f;
    }
    else {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      pcVar6 = "\"string != NULL && sizeInBytes > 0\"";
      uVar4 = 0x85;
    }
  }
  (*sMBUSafeCRTAssertFunc)
            (pcVar6,"SafeCRT assert failed",
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vsprintf.c"
             ,uVar4);
  return -1;
}

Assistant:

int __cdecl _vsprintf_s (
        char *string,
        size_t sizeInBytes,
        const char *format,
        va_list ap
        )
{
    int retvalue = -1;

    /* validation section */
    _VALIDATE_RETURN(format != NULL, EINVAL, -1);
    _VALIDATE_RETURN(string != NULL && sizeInBytes > 0, EINVAL, -1);

    retvalue = _vsnprintf_helper(_output_s, string, sizeInBytes, format, ap);
    if (retvalue < 0)
    {
        string[0] = 0;
        _SECURECRT__FILL_STRING(string, sizeInBytes, 1);
    }
    if (retvalue == -2)
    {
        _VALIDATE_RETURN(("Buffer too small" && 0), ERANGE, -1);
    }
    if (retvalue >= 0)
    {
        _SECURECRT__FILL_STRING(string, sizeInBytes, retvalue + 1);
    }

    return retvalue;
}